

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O3

Mesh * eos::morphablemodel::sample_to_mesh
                 (Mesh *__return_storage_ptr__,VectorXf *shape_instance,VectorXf *color_instance,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci,
                 vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 *texture_coordinates,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                 *texture_triangle_indices)

{
  double *pdVar1;
  float fVar2;
  long lVar3;
  pointer paVar4;
  ulong uVar5;
  float *pfVar6;
  pointer pMVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  long lVar10;
  size_type sVar11;
  pointer paVar12;
  size_type __new_size;
  float fVar13;
  undefined1 auVar14 [16];
  
  lVar10 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage
           .m_rows;
  lVar3 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (lVar3 != 0 && lVar10 != lVar3) {
    __assert_fail("shape_instance.rows() == color_instance.rows() || color_instance.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x25c,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  paVar12 = (texture_coordinates->
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  paVar4 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __new_size = lVar10 / 3;
  if (((paVar12 != paVar4) && ((long)paVar12 - (long)paVar4 >> 4 != __new_size)) &&
     ((texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    __assert_fail("texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) || !texture_triangle_indices .empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x261,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  memset(__return_storage_ptr__,0,0x90);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::resize(&__return_storage_ptr__->vertices,__new_size);
  if (2 < lVar10) {
    uVar9 = 2;
    sVar11 = __new_size;
    do {
      uVar5 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows;
      if ((((long)uVar5 <= (long)(uVar9 - 2)) || (uVar5 <= uVar9 - 1)) || (uVar5 <= uVar9))
      goto LAB_001687f1;
      pfVar6 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      fVar2 = pfVar6[uVar9];
      pMVar7 = (__return_storage_ptr__->vertices).
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)
       ((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage +
       uVar9 * 4 + -8) = *(undefined8 *)(pfVar6 + (uVar9 - 2));
      *(float *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                        m_storage + uVar9 * 4) = fVar2;
      uVar9 = uVar9 + 3;
      sVar11 = sVar11 - 1;
    } while (sVar11 != 0);
  }
  if (0 < (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows) {
    std::
    vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
    ::resize(&__return_storage_ptr__->colors,__new_size);
    auVar8 = _DAT_0016f190;
    if (2 < lVar10) {
      uVar9 = 1;
      do {
        uVar5 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows;
        if ((((long)uVar5 <= (long)(uVar9 - 1)) || (uVar5 <= uVar9)) || (uVar5 <= uVar9 + 1)) {
LAB_001687f1:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<float, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<float, -1, 1>, Level = 0]"
                       );
        }
        pfVar6 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        fVar2 = pfVar6[uVar9 - 1];
        fVar13 = 1.0;
        if (fVar2 <= 1.0) {
          fVar13 = fVar2;
        }
        pMVar7 = (__return_storage_ptr__->colors).
                 super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(ulong *)(pfVar6 + uVar9);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar5;
        auVar14 = minps(auVar8,auVar14);
        *(uint *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + uVar9 * 4 + -4) = ~-(uint)(fVar2 < 0.0) & (uint)fVar13;
        *(ulong *)((long)&(pMVar7->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data + uVar9 * 4) =
             CONCAT44(-(uint)(0.0 <= (float)(uVar5 >> 0x20)) & auVar14._4_4_,
                      -(uint)(0.0 <= (float)uVar5) & auVar14._0_4_);
        uVar9 = uVar9 + 3;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tvi,tvi);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tci,tci);
  paVar12 = (texture_coordinates->
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar4 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (paVar12 != paVar4) {
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::resize(&__return_storage_ptr__->texcoords,(long)paVar4 - (long)paVar12 >> 4);
    paVar12 = (texture_coordinates->
              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((texture_coordinates->
        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != paVar12) {
      lVar10 = 0;
      uVar9 = 0;
      do {
        pdVar1 = (double *)((long)paVar12->_M_elems + lVar10 * 2);
        *(ulong *)((long)&(((__return_storage_ptr__->texcoords).
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.
                          m_data + lVar10) = CONCAT44((float)pdVar1[1],(float)*pdVar1);
        uVar9 = uVar9 + 1;
        paVar12 = (texture_coordinates->
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 8;
      } while (uVar9 < (ulong)((long)(texture_coordinates->
                                     super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar12 >>
                              4));
    }
    if ((texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&__return_storage_ptr__->tti,texture_triangle_indices);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline core::Mesh sample_to_mesh(
    const Eigen::VectorXf& shape_instance, const Eigen::VectorXf& color_instance,
    const std::vector<std::array<int, 3>>& tvi, const std::vector<std::array<int, 3>>& tci,
    const std::vector<std::array<double, 2>>&
        texture_coordinates /* = std::vector<std::array<double, 2>>() */,
    const std::vector<std::array<int, 3>>& texture_triangle_indices /* = std::vector<std::array<int, 3>>() */)
{
    assert(shape_instance.rows() == color_instance.rows() ||
           color_instance.size() == 0); // The number of vertices (= model.getDataDimension() / 3) has to be
                                        // equal for both models, or, alternatively, it has to be a shape-only
                                        // model.
    assert(texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) ||
           !texture_triangle_indices
                .empty()); // No texture coordinates are ok. If there are texture
                           // coordinates given, their number needs to be identical to the
                           // number of vertices, or texture_triangle_indices needs to be given.

    const auto num_vertices = shape_instance.rows() / 3;

    core::Mesh mesh;

    // Construct the mesh vertices:
    mesh.vertices.resize(num_vertices);
    for (auto i = 0; i < num_vertices; ++i)
    {
        mesh.vertices[i] = Eigen::Vector3f(
            shape_instance(i * 3 + 0), shape_instance(i * 3 + 1),
            shape_instance(i * 3 + 2)); // Note: This can probably be simplified now, Eigen on both sides!
    }

    // Assign the vertex colour information if it's not a shape-only model:
    if (color_instance.size() > 0)
    {
        mesh.colors.resize(num_vertices);
        for (auto i = 0; i < num_vertices; ++i)
        {
            mesh.colors[i] = Eigen::Vector3f(
                cpp17::clamp(color_instance(i * 3 + 0), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 1), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 2), 0.0f, 1.0f)); // We use RGB order everywhere.
        }
    }

    // Assign the triangle lists:
    mesh.tvi = tvi;
    mesh.tci = tci; // tci will be empty in case of a shape-only model

    // Texture coordinates, if the model has them:
    if (!texture_coordinates.empty())
    {
        mesh.texcoords.resize(texture_coordinates.size());
        for (auto i = 0; i < texture_coordinates.size(); ++i)
        {
            mesh.texcoords[i] = Eigen::Vector2f(texture_coordinates[i][0], texture_coordinates[i][1]);
        }
        if (!texture_triangle_indices.empty())
        {
            mesh.tti = texture_triangle_indices;
        }
    }

    return mesh;
}